

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteBuiltin_db_last_record_id(jx9_context *pCtx,int argc,jx9_value **argv)

{
  jx9_user_func *pjVar1;
  uint uVar2;
  char *pcVar3;
  unqlite_col *puVar4;
  int iFlag;
  jx9_value *pObj;
  jx9_vm *pVm;
  jx9_real jVar5;
  int nByte;
  SyString sName;
  uint local_24;
  SyString local_20;
  
  if (argc < 1) {
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar3 = "Missing collection name";
LAB_00117df7:
    jx9VmThrowError(pVm,&pjVar1->sName,1,pcVar3);
  }
  else {
    pcVar3 = jx9_value_to_string(*argv,(int *)&local_24);
    if ((int)local_24 < 1) {
      pjVar1 = pCtx->pFunc;
      pVm = pCtx->pVm;
      pcVar3 = "Invalid collection name";
      goto LAB_00117df7;
    }
    local_20.nByte = local_24;
    local_20.zString = pcVar3;
    puVar4 = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&local_20,iFlag);
    if (puVar4 != (unqlite_col *)0x0) {
      jVar5 = 0.0;
      if (puVar4->nLastid != 0) {
        jVar5 = (jx9_real)(puVar4->nLastid + -1);
      }
      pObj = pCtx->pRet;
      jx9MemObjRelease(pObj);
      (pObj->x).rVal = jVar5;
      uVar2 = 2;
      goto LAB_00117e19;
    }
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
  uVar2 = 8;
LAB_00117e19:
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | uVar2;
  return 0;
}

Assistant:

static int unqliteBuiltin_db_last_record_id(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		jx9_result_int64(pCtx,unqliteCollectionLastRecordId(pCol));
	}else{
		/* No such collection, return FALSE */
		jx9_result_bool(pCtx,0);
	}
	return JX9_OK;
}